

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real __thiscall amrex::MultiFab::max(MultiFab *this,Box *region,int comp,int nghost,bool local)

{
  int i;
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  Box lhs;
  Real local_f0;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
  local_f0 = -1.79769313486232e+308;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox((Box *)&local_d0,&mfi,nghost);
    lhs.bigend.vect[2] = local_d0.kstride._4_4_;
    lhs.btype.itype = (uint)local_d0.nstride;
    lhs.bigend.vect[1] = (int)local_d0.kstride;
    lhs.smallend.vect._0_8_ = local_d0.p;
    lhs.smallend.vect[2] = (int)local_d0.jstride;
    lhs.bigend.vect[0] = local_d0.jstride._4_4_;
    Box::operator&=(&lhs,region);
    if ((((lhs.smallend.vect[0] <= lhs.bigend.vect[0]) &&
         (lhs.smallend.vect[1] <= lhs.bigend.vect[1])) &&
        (lhs.smallend.vect[2] <= lhs.bigend.vect[2])) && (lhs.btype.itype < 8)) {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&this->super_FabArray<amrex::FArrayBox>,&mfi);
      lVar3 = (long)lhs.smallend.vect[2];
      pdVar5 = (double *)
               (CONCAT44(local_d0.nstride._4_4_,(uint)local_d0.nstride) * (long)comp * 8 +
                (lVar3 - local_d0.begin.z) *
                CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride) * 8 +
                ((long)lhs.smallend.vect[1] - (long)local_d0.begin.y) *
                CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride) * 8 +
                (long)lhs.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p);
      for (; lVar2 = (long)lhs.smallend.vect[1], pdVar6 = pdVar5, lVar3 <= lhs.bigend.vect[2];
          lVar3 = lVar3 + 1) {
        for (; lVar1 = (long)lhs.smallend.vect[0], pdVar4 = pdVar6, lVar2 <= lhs.bigend.vect[1];
            lVar2 = lVar2 + 1) {
          for (; lVar1 <= lhs.bigend.vect[0]; lVar1 = lVar1 + 1) {
            dVar7 = *pdVar4;
            if (*pdVar4 <= local_f0) {
              dVar7 = local_f0;
            }
            pdVar4 = pdVar4 + 1;
            local_f0 = dVar7;
          }
          pdVar6 = pdVar6 + CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride);
        }
        pdVar5 = pdVar5 + CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride);
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return local_f0;
}

Assistant:

Real
MultiFab::max (const Box& region, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::max(region)");

    Real mx = std::numeric_limits<Real>::lowest();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (region.contains(i,j,k)) {
                return ma[box_no](i,j,k,comp);
            } else {
                return AMREX_REAL_LOWEST;
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost) & region;
            if (bx.ok()) {
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mx = std::max(mx, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Max(mx, ParallelContext::CommunicatorSub());
    }

    return mx;
}